

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(unsigned_long lhs,
         SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> this;
  unsigned_short in_SI;
  unsigned_long in_RDI;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffd8;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffe0;
  undefined6 in_stack_ffffffffffffffe8;
  unsigned_long local_10;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  
  local_10 = in_RDI;
  local_4.m_int = in_SI;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_2);
  bVar1 = ModulusSimpleCaseHelper<unsigned_short,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(local_10,local_4,&local_2);
  if (!bVar1) {
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffd8,&local_10);
    SafeInt::operator_cast_to_unsigned_short(in_stack_ffffffffffffffe0);
    this = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                     ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                       *)CONCAT26(local_4.m_int,in_stack_ffffffffffffffe8),
                      (unsigned_short)((ulong)in_stack_ffffffffffffffe0 >> 0x30));
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               this.m_int,
               (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffd8.m_int);
  }
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_2.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}